

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::CompactReporter::noMatchingTestCases(CompactReporter *this,string *spec)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_18;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::CompactReporter>).stream;
  uStack_18 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"No test cases matched \'",0x17);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(spec->_M_dataplus)._M_p,spec->_M_string_length);
  uStack_18._0_7_ = CONCAT16(0x27,(undefined6)uStack_18);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_18 + 6),1);
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void CompactReporter::noMatchingTestCases( std::string const& spec ) {
            stream << "No test cases matched '" << spec << '\'' << '\n';
        }